

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O3

void __thiscall higan::Buffer::Append(Buffer *this,char *begin,size_t len)

{
  size_t sVar1;
  ulong uVar2;
  pointer pcVar3;
  pointer pcVar4;
  
  pcVar4 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar3 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar1 = this->write_idx_;
  if ((ulong)((long)pcVar3 - (long)(pcVar4 + sVar1)) < len) {
    CopyExDataToBuffer(this,begin,len);
    return;
  }
  if (len != 0) {
    memmove(pcVar4 + sVar1,begin,len);
    sVar1 = this->write_idx_;
    pcVar4 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar3 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  uVar2 = sVar1 + len;
  if ((ulong)((long)pcVar3 - (long)pcVar4) <= sVar1 + len) {
    uVar2 = (long)pcVar3 - (long)pcVar4;
  }
  this->write_idx_ = uVar2;
  return;
}

Assistant:

void Buffer::Append(const char* begin, size_t len)
{
	if (len > WritableSize())
	{
		CopyExDataToBuffer(begin, len);
	}
	else
	{
		std::copy(begin, begin + len, WriteBegin());
		AddWriteIndex(len);
	}
}